

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O2

StringPiece __thiscall icu_63::Formattable::getDecimalNumber(Formattable *this,UErrorCode *status)

{
  CharString *pCVar1;
  StringPiece SVar2;
  StringPiece local_10;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pCVar1 = this->fDecimalStr;
    if (pCVar1 == (CharString *)0x0) {
      pCVar1 = internalGetCharString(this,status);
      if (pCVar1 == (CharString *)0x0) goto LAB_0021f325;
    }
    local_10.ptr_ = (pCVar1->buffer).ptr;
    local_10.length_ = pCVar1->len;
  }
  else {
LAB_0021f325:
    StringPiece::StringPiece(&local_10,"");
  }
  SVar2.length_ = local_10.length_;
  SVar2.ptr_ = local_10.ptr_;
  SVar2._12_4_ = 0;
  return SVar2;
}

Assistant:

StringPiece Formattable::getDecimalNumber(UErrorCode &status) {
    if (U_FAILURE(status)) {
        return "";
    }
    if (fDecimalStr != NULL) {
      return fDecimalStr->toStringPiece();
    }

    CharString *decimalStr = internalGetCharString(status);
    if(decimalStr == NULL) {
      return ""; // getDecimalNumber returns "" for error cases
    } else {
      return decimalStr->toStringPiece();
    }
}